

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_equal_address
                  (char *file,wchar_t line,void *v1,char *e1,void *v2,char *e2,void *extra)

{
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  if (v1 != v2) {
    failure_start(file,line,"%s != %s",e1,e2);
    logprintf("      %s=0x%llx\n",e1,v1);
    logprintf("      %s=0x%llx\n",e2,v2);
    failure_finish(extra);
  }
  return (uint)(v1 == v2);
}

Assistant:

int
assertion_equal_address(const char *file, int line,
    const void *v1, const char *e1, const void *v2, const char *e2, void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      %s=0x%llx\n", e1, (unsigned long long)(uintptr_t)v1);
	logprintf("      %s=0x%llx\n", e2, (unsigned long long)(uintptr_t)v2);
	failure_finish(extra);
	return (0);
}